

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool GlobOpt::DoInlineArgsOpt(Func *func)

{
  uint uVar1;
  Func *this;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  
  this = func->topFunc;
  if (this == func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3d96,"(topFunc != func)","topFunc != func");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  sourceContextId = Func::GetSourceContextId(this);
  functionId = Func::GetLocalFunctionId(this);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,InlineArgsOptPhase,sourceContextId,functionId);
  if ((bVar3) || (uVar1 = *(uint *)&func->field_0x240, ((uVar1 >> 10 | uVar1) & 1) != 0)) {
    bVar3 = false;
  }
  else {
    bVar3 = (bool)((byte)(uVar1 >> 0xb) & 1);
  }
  return bVar3;
}

Assistant:

bool
GlobOpt::DoInlineArgsOpt(Func const * func)
{
    Func const * topFunc = func->GetTopFunc();
    Assert(topFunc != func);
    bool doInlineArgsOpt =
        !PHASE_OFF(Js::InlineArgsOptPhase, topFunc) &&
        !func->GetHasCalls() &&
        !func->GetHasUnoptimizedArgumentsAccess() &&
        func->m_canDoInlineArgsOpt;
    return doInlineArgsOpt;
}